

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O2

bool __thiscall Js::AsmJsFunctionInfo::Init(AsmJsFunctionInfo *this,AsmJsFunc *func)

{
  Recycler *this_00;
  AsmJsVarType type;
  ScriptContext *pSVar1;
  Recycler *pRVar2;
  Which *ptr;
  uint *ptr_00;
  BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *ptr_01;
  AsmJsType *pAVar3;
  ushort uVar4;
  ArgSlot i;
  ushort uVar5;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  WAsmJs::TypedRegisterAllocator::CommitToFunctionInfo
            (&func->mTypedRegisterAllocator,this,func->mFuncBody);
  pSVar1 = FunctionProxy::GetScriptContext((FunctionProxy *)func->mFuncBody);
  this_00 = pSVar1->recycler;
  uVar5 = (func->super_AsmJsFunctionDeclaration).mArgCount;
  data.plusSize = (size_t)uVar5;
  this->mArgCount = uVar5;
  if (data.plusSize == 0) {
    uVar5 = 0;
  }
  else {
    local_58 = (undefined1  [8])&AsmJsVarType::Which::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_461552b;
    data.filename._0_4_ = 0x338;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_58);
    ptr = Memory::AllocateArray<Memory::Recycler,Js::AsmJsVarType::Which,false>
                    ((Memory *)pRVar2,(Recycler *)Memory::Recycler::AllocLeaf,0,
                     (ulong)this->mArgCount);
    Memory::WriteBarrierPtr<Js::AsmJsVarType::Which>::WriteBarrierSet(&this->mArgType,ptr);
    uVar5 = this->mArgCount;
  }
  uVar4 = 3;
  if (3 < uVar5) {
    uVar4 = uVar5;
  }
  this->mArgSizesLength = uVar4;
  data.plusSize = (size_t)uVar4;
  local_58 = (undefined1  [8])&unsigned_int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_461552b;
  data.filename._0_4_ = 0x33e;
  pRVar2 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_58);
  ptr_00 = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                     ((Memory *)pRVar2,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                      (ulong)this->mArgSizesLength);
  Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierSet(&this->mArgSizes,ptr_00);
  (this->mReturnType).which_ =
       *(Type *)&(func->super_AsmJsFunctionDeclaration).super_AsmJsSymbol.field_0x14;
  local_58 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<int,long,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_461552b;
  data.filename._0_4_ = 0x341;
  pRVar2 = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_58);
  ptr_01 = (BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)new<Memory::Recycler>(0x38,pRVar2,0x37a1d4);
  (ptr_01->buckets).ptr = (int *)0x0;
  (ptr_01->entries).ptr = (SimpleDictionaryEntry<int,_long> *)0x0;
  ptr_01->alloc = this_00;
  ptr_01->size = 0;
  ptr_01->bucketCount = 0;
  ptr_01->count = 0;
  ptr_01->freeCount = 0;
  ptr_01->modFunctionIndex = 0x4b;
  ptr_01->stats = (Type)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierSet(&this->mbyteCodeTJMap,ptr_01);
  for (uVar5 = 0; uVar5 < this->mArgCount; uVar5 = uVar5 + 1) {
    pAVar3 = AsmJsFunctionDeclaration::GetArgType(&func->super_AsmJsFunctionDeclaration,uVar5);
    type = AsmJsVarType::FromCheckedType((AsmJsType)pAVar3->which_);
    SetArgType(this,type,uVar5);
  }
  return true;
}

Assistant:

bool AsmJsFunctionInfo::Init(AsmJsFunc* func)
    {
        func->CommitToFunctionInfo(this, func->GetFuncBody());

        Recycler* recycler = func->GetFuncBody()->GetScriptContext()->GetRecycler();
        mArgCount = func->GetArgCount();
        if (mArgCount > 0)
        {
            mArgType = RecyclerNewArrayLeaf(recycler, AsmJsVarType::Which, mArgCount);
        }

        // on x64, AsmJsExternalEntryPoint reads first 3 elements to figure out how to shadow args on stack
        // always alloc space for these such that we need to do less work in the entrypoint
        mArgSizesLength = max(mArgCount, 3ui16);
        mArgSizes = RecyclerNewArrayLeafZ(recycler, uint, mArgSizesLength);

        mReturnType = func->GetReturnType();
        mbyteCodeTJMap = RecyclerNew(recycler, ByteCodeToTJMap,recycler);

        for(ArgSlot i = 0; i < GetArgCount(); i++)
        {
            AsmJsType varType = func->GetArgType(i);
            SetArgType(AsmJsVarType::FromCheckedType(varType), i);
        }

        return true;
    }